

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlCtxtErrMemory(xmlParserCtxtPtr ctxt)

{
  void *local_28;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  xmlParserCtxtPtr ctxt_local;
  
  channel = (xmlGenericErrorFunc)0x0;
  data = (void *)0x0;
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,1,
                        (xmlError *)0x0);
  }
  else {
    ctxt->errNo = 2;
    ctxt->instate = XML_PARSER_EOF;
    ctxt->wellFormed = 0;
    ctxt->disableSAX = 2;
    if (ctxt->errorHandler == (xmlStructuredErrorFunc)0x0) {
      if ((ctxt->sax->initialized == 0xdeedbeaf) &&
         (ctxt->sax->serror != (xmlStructuredErrorFunc)0x0)) {
        channel = (xmlGenericErrorFunc)ctxt->sax->serror;
        local_28 = ctxt->userData;
      }
      else {
        data = ctxt->sax->error;
        local_28 = ctxt->userData;
      }
    }
    else {
      channel = (xmlGenericErrorFunc)ctxt->errorHandler;
      local_28 = ctxt->errorCtxt;
    }
    xmlRaiseMemoryError((xmlStructuredErrorFunc)channel,(xmlGenericErrorFunc)data,local_28,1,
                        &ctxt->lastError);
  }
  return;
}

Assistant:

void
xmlCtxtErrMemory(xmlParserCtxtPtr ctxt)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data;

    if (ctxt == NULL) {
        xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_PARSER, NULL);
        return;
    }

    ctxt->errNo = XML_ERR_NO_MEMORY;
    ctxt->instate = XML_PARSER_EOF; /* TODO: Remove after refactoring */
    ctxt->wellFormed = 0;
    ctxt->disableSAX = 2;

    if (ctxt->errorHandler) {
        schannel = ctxt->errorHandler;
        data = ctxt->errorCtxt;
    } else if ((ctxt->sax->initialized == XML_SAX2_MAGIC) &&
        (ctxt->sax->serror != NULL)) {
        schannel = ctxt->sax->serror;
        data = ctxt->userData;
    } else {
        channel = ctxt->sax->error;
        data = ctxt->userData;
    }

    xmlRaiseMemoryError(schannel, channel, data, XML_FROM_PARSER,
                        &ctxt->lastError);
}